

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O2

char * mk_rconf_meta_get(mk_rconf *conf,char *key)

{
  mk_list *pmVar1;
  int iVar2;
  
  pmVar1 = &conf->metas;
  do {
    pmVar1 = pmVar1->next;
    if (pmVar1 == &conf->metas) {
      return (char *)0x0;
    }
    iVar2 = strcmp((char *)pmVar1[-1].prev,key);
  } while (iVar2 != 0);
  return (char *)pmVar1[-1].next;
}

Assistant:

char *mk_rconf_meta_get(struct mk_rconf *conf, char *key)
{
    struct mk_list *head;
    struct mk_rconf_entry *meta;

    mk_list_foreach(head, &conf->metas) {
        meta = mk_list_entry(head, struct mk_rconf_entry, _head);
        if (strcmp(meta->key, key) == 0) {
            return meta->val;
        }
    }

    return NULL;
}